

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O1

void ImDrawList_AddImageQuad
               (ImDrawList *self,ImTextureID user_texture_id,ImVec2 a,ImVec2 b,ImVec2 c,ImVec2 d,
               ImVec2 uv_a,ImVec2 uv_b,ImVec2 uv_c,ImVec2 uv_d,ImU32 col)

{
  ImVec2 uv_d_local;
  ImVec2 uv_c_local;
  ImVec2 uv_b_local;
  ImVec2 uv_a_local;
  ImVec2 d_local;
  ImVec2 c_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  uv_d_local = uv_d;
  uv_c_local = uv_c;
  uv_b_local = uv_b;
  uv_a_local = uv_a;
  d_local = d;
  c_local = c;
  b_local = b;
  a_local = a;
  ImDrawList::AddImageQuad
            (self,user_texture_id,&a_local,&b_local,&c_local,&d_local,&uv_a_local,&uv_b_local,
             &uv_c_local,&uv_d_local,col);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddImageQuad (ImDrawList *larg1, ImTextureID *larg2, ImVec2 const *larg3, ImVec2 const *larg4, ImVec2 const *larg5, ImVec2 const *larg6, ImVec2 const *larg7, ImVec2 const *larg8, ImVec2 const *larg9, ImVec2 const *larg10, ImU32 *larg11) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImTextureID arg2 ;
  ImVec2 arg3 ;
  ImVec2 arg4 ;
  ImVec2 arg5 ;
  ImVec2 arg6 ;
  ImVec2 arg7 ;
  ImVec2 arg8 ;
  ImVec2 arg9 ;
  ImVec2 arg10 ;
  ImU32 arg11 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = *larg5;
  arg6 = *larg6;
  arg7 = *larg7;
  arg8 = *larg8;
  arg9 = *larg9;
  arg10 = *larg10;
  arg11 = *larg11;
  try {
    ImDrawList_AddImageQuad(arg1,arg2,arg3,arg4,arg5,arg6,arg7,arg8,arg9,arg10,arg11);
    
  } catch (...) {
    
  }
}